

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

BoxArray * __thiscall amrex::BoxArray::convert(BoxArray *this,_func_Box_Box_ptr *fp)

{
  element_type *peVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  Box local_68;
  Box local_4c;
  
  peVar1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar2 = (int)((long)*(pointer *)
                       ((long)&(peVar1->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data + 8) -
                *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data >> 2) * -0x49249249;
  if (0 < (int)uVar2) {
    uniqify(this);
    lVar4 = 0;
    uVar3 = 0;
    do {
      BATransformer::operator()
                (&local_68,&this->m_bat,
                 (Box *)(*(long *)&(((this->m_ref).
                                     super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data + lVar4));
      (*fp)(&local_4c,&local_68);
      set(this,(int)uVar3,&local_4c);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x1c;
    } while ((uVar2 & 0x7fffffff) != uVar3);
  }
  return this;
}

Assistant:

BoxArray&
BoxArray::convert (Box (*fp)(const Box&))
{
    BL_ASSERT(!(fp == 0));

    const int N = size();
    if (N > 0) {
        uniqify();

#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N; ++i) {
            set(i,fp((*this)[i]));
        }
    }
    return *this;
}